

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void __thiscall testing::internal::CapturedStream::~CapturedStream(CapturedStream *this)

{
  char *__filename;
  CapturedStream *this_local;
  
  __filename = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(&this->filename_);
  remove(__filename);
  std::__cxx11::string::~string((string *)&this->filename_);
  return;
}

Assistant:

~CapturedStream() { remove(filename_.c_str()); }